

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

void * uripOpen(char *URI)

{
  int iVar1;
  char *pcVar2;
  
  if (URI != (char *)0x0) {
    iVar1 = strcmp(URI,"file:///usr/local/etc/xml/catalog");
    if (iVar1 == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      iVar1 = strcmp(urip_rcvsURLs[urip_current],URI);
      if (iVar1 != 0) {
        urip_success = 1;
      }
      urip_rlen = 7;
      pcVar2 = "<list/>";
    }
    return pcVar2;
  }
  return (void *)0x0;
}

Assistant:

static void *
uripOpen(const char * URI) {
    if ((URI == NULL) || (!strcmp(URI, "file://" SYSCONFDIR "/xml/catalog")))
        return(NULL);
    /* Verify we received the escaped URL */
    if (strcmp(urip_rcvsURLs[urip_current], URI))
	urip_success = 0;
    urip_cur = urip_res;
    urip_rlen = strlen(urip_res);
    return((void *) urip_cur);
}